

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AlterDropColumn(Parse *pParse,SrcList *pSrc,Token *pName)

{
  char cVar1;
  ushort uVar2;
  sqlite3 *db;
  Schema *pSVar3;
  Column *pCVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Table *pTab;
  char *zCol;
  Vdbe *p;
  Index **ppIVar9;
  int p2;
  int iVar10;
  Op *pOVar11;
  ulong uVar12;
  char *pcVar13;
  Schema **ppSVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  short sVar18;
  ulong uVar19;
  int regOut;
  int i;
  uint uVar20;
  Index *pIVar21;
  
  db = pParse->db;
  if ((((db->mallocFailed == '\0') &&
       (pTab = sqlite3LocateTableItem(pParse,0,pSrc->a), pTab != (Table *)0x0)) &&
      (iVar5 = isAlterableTable(pParse,pTab), iVar5 == 0)) &&
     ((iVar5 = isRealTable(pParse,pTab,1), iVar5 == 0 &&
      (zCol = sqlite3NameFromToken(db,pName), zCol != (char *)0x0)))) {
    uVar6 = sqlite3ColumnIndex(pTab,zCol);
    if ((int)uVar6 < 0) {
      sqlite3ErrorMsg(pParse,"no such column: \"%T\"",pName);
    }
    else {
      uVar12 = (ulong)uVar6;
      uVar2 = pTab->aCol[uVar12].colFlags;
      if ((uVar2 & 9) == 0) {
        if (pTab->nCol < 2) {
          sqlite3ErrorMsg(pParse,"cannot drop column \"%s\": no other columns exist",zCol);
        }
        else {
          if (pTab->pSchema == (Schema *)0x0) {
            uVar17 = 0xffff8000;
          }
          else {
            uVar17 = 0xffffffff;
            ppSVar14 = &db->aDb->pSchema;
            do {
              uVar17 = (ulong)((int)uVar17 + 1);
              pSVar3 = *ppSVar14;
              ppSVar14 = ppSVar14 + 4;
            } while (pSVar3 != pTab->pSchema);
          }
          iVar16 = (int)uVar17;
          pcVar13 = db->aDb[iVar16].zDbSName;
          iVar5 = sqlite3AuthCheck(pParse,0x1a,pcVar13,pTab->zName,zCol);
          if (iVar5 == 0) {
            uVar20 = (uint)(iVar16 == 1);
            renameTestSchema(pParse,pcVar13,uVar20,"",0);
            renameFixQuotes(pParse,pcVar13,uVar20);
            sqlite3NestedParse(pParse,
                               "UPDATE \"%w\".sqlite_master SET sql = sqlite_drop_column(%d, sql, %d) WHERE (type==\'table\' AND tbl_name=%Q COLLATE nocase)"
                               ,pcVar13,uVar17,(ulong)uVar6);
            renameReloadSchema(pParse,iVar16,2);
            renameTestSchema(pParse,pcVar13,uVar20,"after drop column",1);
            if ((pParse->nErr == 0) && ((pTab->aCol[uVar12].colFlags & 0x20) == 0)) {
              p = sqlite3GetVdbe(pParse);
              iVar5 = pParse->nTab;
              pParse->nTab = iVar5 + 1;
              sqlite3OpenTable(pParse,iVar5,iVar16,pTab,0x71);
              iVar7 = sqlite3VdbeAddOp3(p,0x24,iVar5,0,0);
              iVar16 = pParse->nMem;
              p2 = iVar16 + 1;
              pParse->nMem = p2;
              if ((pTab->tabFlags & 0x80) == 0) {
                sqlite3VdbeAddOp3(p,0x87,iVar5,p2,0);
                uVar8 = (uint)pTab->nCol;
                iVar10 = uVar8 + pParse->nMem;
                pIVar21 = (Index *)0x0;
                uVar20 = 0;
              }
              else {
                ppIVar9 = &pTab->pIndex;
                do {
                  pIVar21 = *ppIVar9;
                  ppIVar9 = &pIVar21->pNext;
                } while ((*(ushort *)&pIVar21->field_0x63 & 3) != 2);
                iVar10 = (uint)pIVar21->nColumn + p2;
                pParse->nMem = iVar10;
                if (pIVar21->nKeyCol == 0) {
                  uVar20 = 0;
                }
                else {
                  uVar8 = 0;
                  do {
                    sqlite3VdbeAddOp3(p,0x5e,iVar5,uVar8,iVar16 + 2 + uVar8);
                    uVar8 = uVar8 + 1;
                    uVar20 = (uint)pIVar21->nKeyCol;
                  } while (uVar8 < pIVar21->nKeyCol);
                  iVar10 = pParse->nMem;
                }
                uVar8 = (uint)(ushort)pTab->nCol;
              }
              iVar10 = iVar10 + 1;
              pParse->nMem = iVar10;
              if (0 < (short)uVar8) {
                uVar17 = 0;
                do {
                  if (uVar17 != uVar12) {
                    pCVar4 = pTab->aCol;
                    if ((pCVar4[uVar17].colFlags & 0x20) == 0) {
                      if (pIVar21 == (Index *)0x0) {
                        regOut = iVar16 + 2 + uVar20;
LAB_0017619b:
                        if (uVar17 == (uint)(int)pTab->iPKey) {
                          sqlite3VdbeAddOp3(p,0x4b,0,regOut,0);
                        }
                        else {
                          cVar1 = pCVar4[uVar17].affinity;
                          if (cVar1 == 'E') {
                            pCVar4[uVar17].affinity = 'C';
                          }
                          sqlite3ExprCodeGetColumnOfTable(p,pTab,iVar5,(int)uVar17,regOut);
                          pTab->aCol[uVar17].affinity = cVar1;
                        }
                        uVar20 = uVar20 + 1;
                        uVar8 = (uint)(ushort)pTab->nCol;
                      }
                      else {
                        uVar15 = (ulong)pIVar21->nColumn;
                        if (uVar15 != 0) {
                          uVar19 = 0;
                          do {
                            if (pIVar21->aiColumn[uVar19] == (short)uVar17) goto LAB_0017614e;
                            uVar19 = uVar19 + 1;
                          } while (uVar15 != uVar19);
                          uVar19 = 0xffff;
LAB_0017614e:
                          sVar18 = (short)uVar19;
                          uVar19 = 0;
                          do {
                            if (pIVar21->aiColumn[uVar19] == (short)uVar6) goto LAB_00176168;
                            uVar19 = uVar19 + 1;
                          } while (uVar15 != uVar19);
                          uVar19 = 0xffff;
LAB_00176168:
                          if ((int)(uint)pIVar21->nKeyCol <= (int)sVar18) {
                            regOut = (iVar16 + 2 + (int)sVar18) - (uint)((short)uVar19 < sVar18);
                            goto LAB_0017619b;
                          }
                        }
                      }
                    }
                  }
                  uVar17 = uVar17 + 1;
                } while ((long)uVar17 < (long)(short)uVar8);
              }
              if (uVar20 == 0) {
                pParse->nMem = pParse->nMem + 1;
                sqlite3VdbeAddOp3(p,0x4b,0,iVar16 + 2,0);
                uVar20 = 1;
              }
              sqlite3VdbeAddOp3(p,0x61,iVar16 + 2,uVar20,iVar10);
              if (pIVar21 == (Index *)0x0) {
                sqlite3VdbeAddOp3(p,0x80,iVar5,iVar10,p2);
              }
              else {
                sqlite3VdbeAddOp4Int(p,0x8a,iVar5,iVar10,iVar16 + 2,(uint)pIVar21->nKeyCol);
              }
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 2;
              }
              sqlite3VdbeAddOp3(p,0x27,iVar5,iVar7 + 1,0);
              if (p->db->mallocFailed == '\0') {
                pOVar11 = p->aOp + iVar7;
              }
              else {
                pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar11->p2 = p->nOp;
            }
          }
        }
      }
      else {
        pcVar13 = "PRIMARY KEY";
        if ((uVar2 & 1) == 0) {
          pcVar13 = "UNIQUE";
        }
        sqlite3ErrorMsg(pParse,"cannot drop %s column: \"%s\"",pcVar13,zCol);
      }
    }
    sqlite3DbFreeNN(db,zCol);
  }
  sqlite3SrcListDelete(db,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterDropColumn(Parse *pParse, SrcList *pSrc, const Token *pName){
  sqlite3 *db = pParse->db;       /* Database handle */
  Table *pTab;                    /* Table to modify */
  int iDb;                        /* Index of db containing pTab in aDb[] */
  const char *zDb;                /* Database containing pTab ("main" etc.) */
  char *zCol = 0;                 /* Name of column to drop */
  int iCol;                       /* Index of column zCol in pTab->aCol[] */

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( NEVER(db->mallocFailed) ) goto exit_drop_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_drop_column;

  /* Make sure this is not an attempt to ALTER a view, virtual table or
  ** system table. */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_drop_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab, 1) ) goto exit_drop_column;

  /* Find the index of the column being dropped. */
  zCol = sqlite3NameFromToken(db, pName);
  if( zCol==0 ){
    assert( db->mallocFailed );
    goto exit_drop_column;
  }
  iCol = sqlite3ColumnIndex(pTab, zCol);
  if( iCol<0 ){
    sqlite3ErrorMsg(pParse, "no such column: \"%T\"", pName);
    goto exit_drop_column;
  }

  /* Do not allow the user to drop a PRIMARY KEY column or a column
  ** constrained by a UNIQUE constraint.  */
  if( pTab->aCol[iCol].colFlags & (COLFLAG_PRIMKEY|COLFLAG_UNIQUE) ){
    sqlite3ErrorMsg(pParse, "cannot drop %s column: \"%s\"",
        (pTab->aCol[iCol].colFlags&COLFLAG_PRIMKEY) ? "PRIMARY KEY" : "UNIQUE",
        zCol
    );
    goto exit_drop_column;
  }

  /* Do not allow the number of columns to go to zero */
  if( pTab->nCol<=1 ){
    sqlite3ErrorMsg(pParse, "cannot drop column \"%s\": no other columns exist",zCol);
    goto exit_drop_column;
  }

  /* Edit the sqlite_schema table */
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  zDb = db->aDb[iDb].zDbSName;
#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, zCol) ){
    goto exit_drop_column;
  }
#endif
  renameTestSchema(pParse, zDb, iDb==1, "", 0);
  renameFixQuotes(pParse, zDb, iDb==1);
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_drop_column(%d, sql, %d) "
      "WHERE (type=='table' AND tbl_name=%Q COLLATE nocase)"
      , zDb, iDb, iCol, pTab->zName
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iDb, INITFLAG_AlterDrop);
  renameTestSchema(pParse, zDb, iDb==1, "after drop column", 1);

  /* Edit rows of table on disk */
  if( pParse->nErr==0 && (pTab->aCol[iCol].colFlags & COLFLAG_VIRTUAL)==0 ){
    int i;
    int addr;
    int reg;
    int regRec;
    Index *pPk = 0;
    int nField = 0;               /* Number of non-virtual columns after drop */
    int iCur;
    Vdbe *v = sqlite3GetVdbe(pParse);
    iCur = pParse->nTab++;
    sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite);
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    reg = ++pParse->nMem;
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, reg);
      pParse->nMem += pTab->nCol;
    }else{
      pPk = sqlite3PrimaryKeyIndex(pTab);
      pParse->nMem += pPk->nColumn;
      for(i=0; i<pPk->nKeyCol; i++){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, reg+i+1);
      }
      nField = pPk->nKeyCol;
    }
    regRec = ++pParse->nMem;
    for(i=0; i<pTab->nCol; i++){
      if( i!=iCol && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ){
        int regOut;
        if( pPk ){
          int iPos = sqlite3TableColumnToIndex(pPk, i);
          int iColPos = sqlite3TableColumnToIndex(pPk, iCol);
          if( iPos<pPk->nKeyCol ) continue;
          regOut = reg+1+iPos-(iPos>iColPos);
        }else{
          regOut = reg+1+nField;
        }
        if( i==pTab->iPKey ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, regOut);
        }else{
          char aff = pTab->aCol[i].affinity;
          if( aff==SQLITE_AFF_REAL ){
            pTab->aCol[i].affinity = SQLITE_AFF_NUMERIC;
          }
          sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOut);
          pTab->aCol[i].affinity = aff;
        }
        nField++;
      }
    }
    if( nField==0 ){
      /* dbsqlfuzz 5f09e7bcc78b4954d06bf9f2400d7715f48d1fef */
      pParse->nMem++;
      sqlite3VdbeAddOp2(v, OP_Null, 0, reg+1);
      nField = 1;
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, reg+1, nField, regRec);
    if( pPk ){
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iCur, regRec, reg+1, pPk->nKeyCol);
    }else{
      sqlite3VdbeAddOp3(v, OP_Insert, iCur, regRec, reg);
    }
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);

    sqlite3VdbeAddOp2(v, OP_Next, iCur, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
  }

exit_drop_column:
  sqlite3DbFree(db, zCol);
  sqlite3SrcListDelete(db, pSrc);
}